

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::
initialize<py_init_module_imgui_funcs(pybind11::module_&)::__57,bool,char_const*,Int&,int,int,int,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
          (cpp_function *this,type *f,type *param_2,name *extra,scope *extra_1,sibling *extra_2,
          arg *extra_3,arg *extra_4,arg_v *extra_5,arg_v *extra_6,arg_v *extra_7)

{
  function_record *rec_00;
  _func_handle_function_call_ptr *p_Var1;
  const_pointer types;
  _lambda_pybind11__detail__function_call___1_ local_41;
  bool is_function_ptr;
  bool has_arg_annotations;
  bool has_args;
  bool has_pos_only_args;
  bool has_kw_only_args;
  function_record *pfStack_40;
  function_record *rec;
  sibling *extra_local_2;
  scope *extra_local_1;
  name *extra_local;
  type *param_5_local;
  type *f_local;
  cpp_function *this_local;
  
  rec = (function_record *)extra_2;
  extra_local_2 = (sibling *)extra_1;
  extra_local_1 = (scope *)extra;
  extra_local = (name *)param_2;
  param_5_local = (type *)f;
  f_local = (type *)this;
  pfStack_40 = make_function_record(this);
  p_Var1 = initialize(py_init_module_imgui_funcs(pybind11::module_&)::$_57&&,bool(*)(char_const*,Int&,int,int,int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,pybind11::arg_const&,pybind11::arg_v_const&,pybind11::arg_v_const&,pybind11::arg_v_const&)
           ::{lambda(pybind11::detail::function_call&)#1}::operator_cast_to_function_pointer
                     (&local_41);
  pfStack_40->impl = p_Var1;
  pybind11::detail::
  process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v>
  ::init((EVP_PKEY_CTX *)extra_local_1);
  rec_00 = pfStack_40;
  types = std::array<const_std::type_info_*,_2UL>::data
                    (&initialize<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/src/imgui.cpp:1471:7),_bool,_const_char_*,_Int_&,_int,_int,_int,_pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v>
                      ::types);
  initialize_generic(this,rec_00,
                     initialize<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/src/imgui.cpp:1471:7),_bool,_const_char_*,_Int_&,_int,_int,_int,_pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v>
                     ::signature.text,types,5);
  return;
}

Assistant:

void initialize(Func &&f, Return (*)(Args...), const Extra&... extra) {
        using namespace detail;
        struct capture { remove_reference_t<Func> f; };

        /* Store the function including any extra state it might have (e.g. a lambda capture object) */
        auto rec = make_function_record();

        /* Store the capture object directly in the function record if there is enough space */
        if (sizeof(capture) <= sizeof(rec->data)) {
            /* Without these pragmas, GCC warns that there might not be
               enough space to use the placement new operator. However, the
               'if' statement above ensures that this is the case. */
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wplacement-new"
#endif
            new ((capture *) &rec->data) capture { std::forward<Func>(f) };
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic pop
#endif
            if (!std::is_trivially_destructible<Func>::value)
                rec->free_data = [](function_record *r) { ((capture *) &r->data)->~capture(); };
        } else {
            rec->data[0] = new capture { std::forward<Func>(f) };
            rec->free_data = [](function_record *r) { delete ((capture *) r->data[0]); };
        }

        /* Type casters for the function arguments and return value */
        using cast_in = argument_loader<Args...>;
        using cast_out = make_caster<
            conditional_t<std::is_void<Return>::value, void_type, Return>
        >;

        static_assert(expected_num_args<Extra...>(sizeof...(Args), cast_in::has_args, cast_in::has_kwargs),
                      "The number of argument annotations does not match the number of function arguments");

        /* Dispatch code which converts function arguments and performs the actual function call */
        rec->impl = [](function_call &call) -> handle {
            cast_in args_converter;

            /* Try to cast the function arguments into the C++ domain */
            if (!args_converter.load_args(call))
                return PYBIND11_TRY_NEXT_OVERLOAD;

            /* Invoke call policy pre-call hook */
            process_attributes<Extra...>::precall(call);

            /* Get a pointer to the capture object */
            auto data = (sizeof(capture) <= sizeof(call.func.data)
                         ? &call.func.data : call.func.data[0]);
            auto *cap = const_cast<capture *>(reinterpret_cast<const capture *>(data));

            /* Override policy for rvalues -- usually to enforce rvp::move on an rvalue */
            return_value_policy policy = return_value_policy_override<Return>::policy(call.func.policy);

            /* Function scope guard -- defaults to the compile-to-nothing `void_type` */
            using Guard = extract_guard_t<Extra...>;

            /* Perform the function call */
            handle result = cast_out::cast(
                std::move(args_converter).template call<Return, Guard>(cap->f), policy, call.parent);

            /* Invoke call policy post-call hook */
            process_attributes<Extra...>::postcall(call, result);

            return result;
        };

        /* Process any user-provided function attributes */
        process_attributes<Extra...>::init(extra..., rec);

        {
            constexpr bool has_kw_only_args = any_of<std::is_same<kw_only, Extra>...>::value,
                           has_pos_only_args = any_of<std::is_same<pos_only, Extra>...>::value,
                           has_args = any_of<std::is_same<args, Args>...>::value,
                           has_arg_annotations = any_of<is_keyword<Extra>...>::value;
            static_assert(has_arg_annotations || !has_kw_only_args, "py::kw_only requires the use of argument annotations");
            static_assert(has_arg_annotations || !has_pos_only_args, "py::pos_only requires the use of argument annotations (for docstrings and aligning the annotations to the argument)");
            static_assert(!(has_args && has_kw_only_args), "py::kw_only cannot be combined with a py::args argument");
        }

        /* Generate a readable signature describing the function's arguments and return value types */
        static constexpr auto signature = _("(") + cast_in::arg_names + _(") -> ") + cast_out::name;
        PYBIND11_DESCR_CONSTEXPR auto types = decltype(signature)::types();

        /* Register the function with Python from generic (non-templated) code */
        initialize_generic(rec, signature.text, types.data(), sizeof...(Args));

        if (cast_in::has_args) rec->has_args = true;
        if (cast_in::has_kwargs) rec->has_kwargs = true;

        /* Stash some additional information used by an important optimization in 'functional.h' */
        using FunctionType = Return (*)(Args...);
        constexpr bool is_function_ptr =
            std::is_convertible<Func, FunctionType>::value &&
            sizeof(capture) == sizeof(void *);
        if (is_function_ptr) {
            rec->is_stateless = true;
            rec->data[1] = const_cast<void *>(reinterpret_cast<const void *>(&typeid(FunctionType)));
        }
    }